

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-grib-cursor.c
# Opt level: O2

int coda_grib_cursor_read_float(coda_cursor_conflict *cursor,float *dst)

{
  byte bVar1;
  coda_dynamic_type_struct *pcVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined1 auVar11 [16];
  int iVar12;
  byte *pbVar13;
  sbyte sVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  byte *dst_00;
  ulong uVar19;
  coda_product *product;
  long lVar20;
  uchar *v;
  uint8_t *dst_01;
  ulong uVar21;
  long lVar22;
  long byte_offset;
  float fVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined8 uStack_70;
  undefined4 local_68;
  uint8_t buffer [4];
  undefined8 local_58;
  coda_product *local_50;
  long local_48;
  long local_40;
  ulong local_38;
  undefined1 auVar26 [16];
  
  iVar12 = cursor->n;
  if (iVar12 < 2) {
    uStack_70 = (code *)0x116987;
    __assert_fail("cursor->n > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-grib-cursor.c"
                  ,0x90,"int coda_grib_cursor_read_float(const coda_cursor *, float *)");
  }
  pcVar2 = cursor->stack[iVar12 - 2].type;
  if (pcVar2->definition->type_class != coda_array_class) {
    uStack_70 = read_bytes;
    __assert_fail("array->definition->type_class == coda_array_class",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-grib-cursor.c"
                  ,0x92,"int coda_grib_cursor_read_float(const coda_cursor *, float *)");
  }
  uVar16 = cursor->stack[iVar12 - 1].index;
  if (*(int *)&pcVar2[2].definition == 0) {
    uStack_70 = (code *)0x11663d;
    iVar12 = read_bytes((coda_product *)cursor->product[1].filename,
                        (*(long *)(pcVar2 + 2) >> 3) + uVar16 * 4,4,dst);
    if (iVar12 == 0) {
      fVar23 = *dst;
      auVar27 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)fVar23 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)fVar23 >> 0x10),fVar23)) >>
                                                  0x20),fVar23) >> 0x18),(char)((uint)fVar23 >> 8)),
                                 (ushort)SUB41(fVar23,0)) & 0xffffff00ffffff);
      auVar27 = pshuflw(auVar27,auVar27,0x1b);
      sVar3 = auVar27._0_2_;
      sVar4 = auVar27._2_2_;
      sVar5 = auVar27._4_2_;
      sVar6 = auVar27._6_2_;
      *dst = (float)CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar27[6] - (0xff < sVar6),
                             CONCAT12((0 < sVar5) * (sVar5 < 0x100) * auVar27[4] - (0xff < sVar5),
                                      CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar27[2] -
                                               (0xff < sVar4),
                                               (0 < sVar3) * (sVar3 < 0x100) * auVar27[0] -
                                               (0xff < sVar3))));
      return 0;
    }
    return -1;
  }
  uVar17 = *(uint *)((long)&pcVar2[2].definition + 4);
  uVar21 = (ulong)(int)uVar17;
  if (uVar21 == 0) {
    fVar23 = *(float *)&pcVar2[3].field_0x4;
LAB_001167e4:
    *dst = fVar23;
  }
  else {
    uVar19 = uVar16;
    if (pcVar2[4].definition != (coda_type *)0x0) {
      bVar1 = *(byte *)((long)&(pcVar2[4].definition)->format + ((long)uVar16 >> 3));
      uVar15 = (uint)uVar16 & 7;
      if ((bVar1 >> ((byte)uVar15 ^ 7) & 1) == 0) {
        uStack_70 = (code *)0x1167e0;
        dVar24 = coda_NaN();
        fVar23 = (float)dVar24;
        goto LAB_001167e4;
      }
      lVar20 = 0;
      lVar18 = (long)uVar16 >> 7;
      if ((long)uVar16 >> 7 < 1) {
        lVar18 = lVar20;
      }
      uVar19 = 0;
      for (; lVar18 * 0x10 != lVar20; lVar20 = lVar20 + 0x10) {
        uVar19 = uVar19 + *(byte *)(*(long *)(pcVar2 + 5) + 0xf + lVar20);
      }
      if ((uVar16 & 0x78) != 0) {
        uVar19 = uVar19 + *(byte *)(*(long *)(pcVar2 + 5) + -1 + ((long)uVar16 >> 3));
      }
      for (lVar18 = 0; -lVar18 != (ulong)uVar15; lVar18 = lVar18 + -1) {
        uVar19 = uVar19 + ((bVar1 >> ((int)lVar18 + 7U & 0x1f) & 1) != 0);
      }
    }
    lVar20 = (long)(int)(-((int)uVar17 >> 3) - (uint)((uVar17 & 7) != 0));
    dst_00 = (byte *)((long)&local_58 + lVar20);
    lVar22 = uVar19 * uVar21 + *(long *)(pcVar2 + 2);
    product = (coda_product *)cursor->product[1].filename;
    uVar16 = (ulong)((uint)lVar22 & 7);
    lVar18 = uVar16 + uVar21;
    uVar15 = -(int)lVar18 & 7;
    byte_offset = lVar22 >> 3;
    sVar14 = (sbyte)uVar15;
    local_58 = dst;
    if (lVar18 < 9) {
      uStack_70 = (code *)0x1166ff;
      iVar12 = read_bytes(product,byte_offset,1,dst_00);
      if (iVar12 != 0) {
        return -1;
      }
      if (uVar15 != 0) {
        *dst_00 = *dst_00 >> sVar14;
      }
      if ((uVar21 & 7) != 0) {
        *dst_00 = *dst_00 & ~(byte)(-1 << ((byte)uVar17 & 0x1f));
      }
    }
    else if (uVar15 == 0) {
      uVar16 = uVar21 & 7;
      if (uVar16 != 0) {
        uStack_70 = (code *)0x11680f;
        iVar12 = read_bytes(product,byte_offset,1,buffer);
        if (iVar12 != 0) {
          return -1;
        }
        *(uint8_t *)((long)&local_58 + lVar20) = ~(-1 << (sbyte)uVar16) & buffer[0];
        dst_00 = (byte *)((long)&local_58 + lVar20 + 1);
        lVar22 = lVar22 + uVar16;
        uVar21 = uVar21 & 0xfffffffffffffff8;
      }
      if (0 < (long)uVar21) {
        uStack_70 = (code *)0x116858;
        iVar12 = read_bytes(product,lVar22 >> 3,uVar21 >> 3,dst_00);
        if (iVar12 != 0) {
          return -1;
        }
      }
    }
    else {
      uVar17 = (int)uVar17 % 0x18;
      local_50 = product;
      if (uVar17 != 0) {
        local_38 = (ulong)(int)uVar17;
        uVar16 = uVar16 + local_38;
        local_40 = ((uVar16 >> 3) + 1) - (ulong)((uVar16 & 7) == 0);
        local_48 = ((local_38 >> 3) + 1) - (ulong)((uVar17 & 7) == 0);
        dst_01 = buffer;
        uStack_70 = (code *)0x11679a;
        iVar12 = read_bytes(product,byte_offset,local_40,dst_01);
        uVar16 = local_38;
        lVar18 = local_48;
        product = local_50;
        if (iVar12 != 0) {
          return -1;
        }
        local_68 = 0;
        for (lVar20 = 0; -lVar20 != local_40; lVar20 = lVar20 + -1) {
          buffer[lVar20 + -1] = *dst_01;
          dst_01 = dst_01 + 1;
        }
        local_68 = ~(-1 << ((byte)local_38 & 0x1f)) & 0U >> (sVar14 + (char)local_40 * -8 & 0x1fU);
        pbVar13 = dst_00;
        lVar20 = local_48;
        while (lVar20 != 0) {
          *pbVar13 = *(byte *)((long)&uStack_70 + lVar20 + 7);
          pbVar13 = pbVar13 + 1;
          lVar20 = lVar20 + -1;
        }
        dst_00 = dst_00 + lVar18;
        lVar22 = lVar22 + uVar16;
        uVar21 = uVar21 - uVar16;
      }
      for (; 0 < (long)uVar21; uVar21 = uVar21 - 0x18) {
        uStack_70 = (code *)0x1168c7;
        iVar12 = read_bytes(product,lVar22 >> 3,4,buffer);
        if (iVar12 != 0) {
          return -1;
        }
        auVar11._1_9_ = SUB169(ZEXT816(0) << 0x40,7);
        auVar11[0] = buffer[3];
        auVar11._10_6_ = 0;
        auVar26._5_11_ = SUB1611(auVar11 << 0x30,5);
        auVar26[4] = buffer[2];
        auVar26[0] = buffer[0];
        auVar26[1] = buffer[1];
        auVar26[2] = buffer[2];
        auVar26[3] = buffer[3];
        auVar27._12_4_ = 0;
        auVar27._0_12_ = auVar26._4_12_;
        auVar25._3_13_ = SUB1613(auVar27 << 0x20,3);
        auVar25[2] = buffer[1];
        auVar25[0] = buffer[0];
        auVar25[1] = 0;
        auVar27 = pshuflw(auVar25,auVar25,0x1b);
        sVar3 = auVar27._0_2_;
        sVar4 = auVar27._2_2_;
        sVar5 = auVar27._4_2_;
        sVar6 = auVar27._6_2_;
        local_68 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar27[6] - (0xff < sVar6),
                            CONCAT12((0 < sVar5) * (sVar5 < 0x100) * auVar27[4] - (0xff < sVar5),
                                     CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar27[2] -
                                              (0xff < sVar4),
                                              (0 < sVar3) * (sVar3 < 0x100) * auVar27[0] -
                                              (0xff < sVar3)))) >> sVar14;
        *dst_00 = (byte)(local_68 >> 0x10);
        dst_00[1] = (byte)(local_68 >> 8);
        dst_00[2] = (byte)local_68;
        dst_00 = dst_00 + 3;
        lVar22 = lVar22 + 0x18;
        product = local_50;
      }
    }
    auVar27 = pshuflw(ZEXT816(0) << 0x40,ZEXT816(0) << 0x40,0x1b);
    auVar27 = pshufhw(auVar27,auVar27,0x1b);
    sVar3 = auVar27._0_2_;
    sVar4 = auVar27._2_2_;
    sVar5 = auVar27._4_2_;
    sVar6 = auVar27._6_2_;
    sVar7 = auVar27._8_2_;
    sVar8 = auVar27._10_2_;
    sVar9 = auVar27._12_2_;
    sVar10 = auVar27._14_2_;
    *local_58 = (float)((double)CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar27[0xe] -
                                         (0xff < sVar10),
                                         CONCAT16((0 < sVar9) * (sVar9 < 0x100) * auVar27[0xc] -
                                                  (0xff < sVar9),
                                                  CONCAT15((0 < sVar8) * (sVar8 < 0x100) *
                                                           auVar27[10] - (0xff < sVar8),
                                                           CONCAT14((0 < sVar7) * (sVar7 < 0x100) *
                                                                    auVar27[8] - (0xff < sVar7),
                                                                    CONCAT13((0 < sVar6) *
                                                                             (sVar6 < 0x100) *
                                                                             auVar27[6] -
                                                                             (0xff < sVar6),
                                                                             CONCAT12((0 < sVar5) *
                                                                                      (sVar5 < 0x100
                                                                                      ) * auVar27[4]
                                                                                      - (0xff < 
                                                  sVar5),CONCAT11((0 < sVar4) * (sVar4 < 0x100) *
                                                                  auVar27[2] - (0xff < sVar4),
                                                                  (0 < sVar3) * (sVar3 < 0x100) *
                                                                  auVar27[0] - (0xff < sVar3))))))))
                        * (double)pcVar2[3].definition + *(double *)(pcVar2 + 4));
  }
  return 0;
}

Assistant:

int coda_grib_cursor_read_float(const coda_cursor *cursor, float *dst)
{
    coda_grib_value_array *array;
    long index;

    assert(cursor->n > 1);
    array = (coda_grib_value_array *)cursor->stack[cursor->n - 2].type;
    assert(array->definition->type_class == coda_array_class);
    index = cursor->stack[cursor->n - 1].index;
    if (array->simple_packing)
    {
        int64_t ivalue = 0;
        uint8_t *buffer;

        if (array->element_bit_size == 0)
        {
            *((float *)dst) = array->referenceValue;
            return 0;
        }
        if (array->bitmask != NULL)
        {
            uint8_t bm;
            long bm_index;
            long value_index = 0;
            long i;

            bm_index = index >> 3;
            bm = array->bitmask[bm_index];
            if (!((bm >> (7 - (index & 0x7))) & 1))
            {
                /* bitmask value is 0 -> return NaN */
                *((float *)dst) = (float)coda_NaN();
                return 0;
            }

            /* bitmask value is 1 -> update index to be the index in the value array */
            for (i = 0; i < bm_index >> 4; i++)
            {
                /* advance value_index based on cumsum of blocks of 128 bitmap bits (= 16 bytes) */
                value_index += array->bitmask_cumsum128[16 * i + 15];
            }
            if (bm_index % 16 != 0)
            {
                value_index += array->bitmask_cumsum128[bm_index - 1];
            }
            bm = array->bitmask[bm_index];
            for (i = 0; i < (index & 0x7); i++)
            {
                value_index += (bm >> (7 - i)) & 1;
            }
            index = value_index;
        }
        buffer = &((uint8_t *)&ivalue)[8 - bit_size_to_byte_size(array->element_bit_size)];
        if (read_bits(((coda_grib_product *)cursor->product)->raw_product,
                      array->bit_offset + index * array->element_bit_size, array->element_bit_size, buffer) != 0)
        {
            return -1;
        }
#ifndef WORDS_BIGENDIAN
        swap8(&ivalue);
#endif
        *((float *)dst) = (float)(ivalue * array->scalefactor + array->offset);
    }
    else
    {
        if (read_bytes(((coda_grib_product *)cursor->product)->raw_product, (array->bit_offset >> 3) + index * 4, 4,
                       dst) != 0)
        {
            return -1;
        }
#ifndef WORDS_BIGENDIAN
        swap_float(dst);
#endif
    }

    return 0;
}